

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O0

HelicsTime helicsFederateGetTimeProperty(HelicsFederate fed,int timeProperty,HelicsError *err)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  uint in_ESI;
  Time timeprop;
  Federate *fedObj;
  double local_58;
  TimeRepresentation<count_time<9,_long>_> in_stack_ffffffffffffffb8;
  HelicsFederate in_stack_ffffffffffffffc0;
  TimeRepresentation<count_time<9,_long>_> local_30;
  Federate *local_28;
  uint local_14;
  double local_8;
  
  local_14 = in_ESI;
  local_28 = getFed(in_stack_ffffffffffffffc0,
                    (HelicsError *)in_stack_ffffffffffffffb8.internalTimeCode);
  if (local_28 == (Federate *)0x0) {
    local_8 = -1.785e+39;
  }
  else {
    iVar2 = (*local_28->_vptr_Federate[7])(local_28,(ulong)local_14);
    local_30.internalTimeCode = CONCAT44(extraout_var,iVar2);
    TimeRepresentation<count_time<9,_long>_>::maxVal();
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<
                      (&local_30,
                       (TimeRepresentation<count_time<9,_long>_> *)&stack0xffffffffffffffb8);
    if (bVar1) {
      local_58 = TimeRepresentation::operator_cast_to_double
                           ((TimeRepresentation<count_time<9,_long>_> *)0x1be07d);
    }
    else {
      local_58 = 9223372036.854774;
    }
    local_8 = local_58;
  }
  return local_8;
}

Assistant:

HelicsTime helicsFederateGetTimeProperty(HelicsFederate fed, int timeProperty, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return HELICS_TIME_INVALID;
    }
    try {
        auto timeprop = fedObj->getTimeProperty(timeProperty);

        return (timeprop < helics::Time::maxVal()) ? static_cast<double>(timeprop) : HELICS_TIME_MAXTIME;
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
        return HELICS_TIME_INVALID;
    }
    // LCOV_EXCL_STOP
}